

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def.hpp
# Opt level: O1

string * __thiscall
upb::MessageDefPtr::MiniDescriptorEncode_abi_cxx11_
          (string *__return_storage_ptr__,MessageDefPtr *this)

{
  upb_Arena *a;
  upb_StringView md;
  upb_StringView local_28;
  
  a = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  upb_MessageDef_MiniDescriptorEncode(this->ptr_,a,&local_28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_28.data,local_28.data + local_28.size);
  if (a != (upb_Arena *)0x0) {
    upb_Arena_Free(a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MiniDescriptorEncode() const {
    upb::Arena arena;
    upb_StringView md;
    upb_MessageDef_MiniDescriptorEncode(ptr_, arena.ptr(), &md);
    return std::string(md.data, md.size);
  }